

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall google::protobuf::RepeatedField<long>::~RepeatedField(RepeatedField<long> *this)

{
  long *plVar1;
  
  if (0 < this->total_size_) {
    plVar1 = elements(this);
    InternalDeallocate(this,(Rep *)(plVar1 + -1),this->total_size_);
    return;
  }
  return;
}

Assistant:

RepeatedField<Element>::~RepeatedField() {
  if (total_size_ > 0) {
    InternalDeallocate(rep(), total_size_);
  }
}